

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_lex.c
# Opt level: O0

char * lj_lex_token2str(LexState *ls,LexToken tok)

{
  LexToken tok_local;
  LexState *ls_local;
  
  if (tok < 0x101) {
    if ((""[(long)tok + 1] & 1) == 0) {
      ls_local = (LexState *)lj_strfmt_pushf(ls->L,"%c",(ulong)(uint)tok);
    }
    else {
      ls_local = (LexState *)lj_strfmt_pushf(ls->L,"char(%d)",(ulong)(uint)tok);
    }
  }
  else {
    ls_local = (LexState *)tokennames[tok + -0x101];
  }
  return (char *)ls_local;
}

Assistant:

const char *lj_lex_token2str(LexState *ls, LexToken tok)
{
  if (tok > TK_OFS)
    return tokennames[tok-TK_OFS-1];
  else if (!lj_char_iscntrl(tok))
    return lj_strfmt_pushf(ls->L, "%c", tok);
  else
    return lj_strfmt_pushf(ls->L, "char(%d)", tok);
}